

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv__stream_queue_fd(uv_stream_t *stream,int fd)

{
  int iVar1;
  uint uVar2;
  int *piStack_28;
  uint queue_size;
  uv__stream_queued_fds_t *queued_fds;
  int fd_local;
  uv_stream_t *stream_local;
  
  piStack_28 = (int *)stream->queued_fds;
  if (piStack_28 == (int *)0x0) {
    piStack_28 = (int *)uv__malloc(0x28);
    if (piStack_28 == (int *)0x0) {
      return -0xc;
    }
    *piStack_28 = 8;
    piStack_28[1] = 0;
    stream->queued_fds = piStack_28;
  }
  else if (*piStack_28 == piStack_28[1]) {
    iVar1 = *piStack_28;
    piStack_28 = (int *)uv__realloc(piStack_28,(ulong)(iVar1 + 7) * 4 + 0xc);
    if (piStack_28 == (int *)0x0) {
      return -0xc;
    }
    *piStack_28 = iVar1 + 8;
    stream->queued_fds = piStack_28;
  }
  uVar2 = piStack_28[1];
  piStack_28[1] = uVar2 + 1;
  piStack_28[(ulong)uVar2 + 2] = fd;
  return 0;
}

Assistant:

static int uv__stream_queue_fd(uv_stream_t* stream, int fd) {
  uv__stream_queued_fds_t* queued_fds;
  unsigned int queue_size;

  queued_fds = stream->queued_fds;
  if (queued_fds == NULL) {
    queue_size = 8;
    queued_fds = uv__malloc((queue_size - 1) * sizeof(*queued_fds->fds) +
                            sizeof(*queued_fds));
    if (queued_fds == NULL)
      return -ENOMEM;
    queued_fds->size = queue_size;
    queued_fds->offset = 0;
    stream->queued_fds = queued_fds;

    /* Grow */
  } else if (queued_fds->size == queued_fds->offset) {
    queue_size = queued_fds->size + 8;
    queued_fds = uv__realloc(queued_fds,
                             (queue_size - 1) * sizeof(*queued_fds->fds) +
                              sizeof(*queued_fds));

    /*
     * Allocation failure, report back.
     * NOTE: if it is fatal - sockets will be closed in uv__stream_close
     */
    if (queued_fds == NULL)
      return -ENOMEM;
    queued_fds->size = queue_size;
    stream->queued_fds = queued_fds;
  }

  /* Put fd in a queue */
  queued_fds->fds[queued_fds->offset++] = fd;

  return 0;
}